

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearPosition.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearPosition::ArchiveIN(ChLinkMotorLinearPosition *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChLinkMotorLinearPosition>(marchive);
  ChLinkMotorLinear::ArchiveIN(&this->super_ChLinkMotorLinear,marchive);
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  return;
}

Assistant:

void ChLinkMotorLinearPosition::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorLinearPosition>();

    // deserialize parent class
    ChLinkMotorLinear::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(pos_offset);
}